

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O0

void __thiscall
qclab::qgates::SWAP<std::complex<float>_>::SWAP(SWAP<std::complex<float>_> *this,int *qubits)

{
  int *qubits_local;
  SWAP<std::complex<float>_> *this_local;
  
  QGate2<std::complex<float>_>::QGate2(&this->super_QGate2<std::complex<float>_>);
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0017a140;
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[6])
            (this,qubits);
  return;
}

Assistant:

SWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }